

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,object_literal_expression *e)

{
  property_assignment_type pVar1;
  int iVar2;
  property_name_and_value_list *this_00;
  expression *peVar3;
  const_reference pvVar4;
  char *pcVar5;
  expression *f;
  size_t i;
  property_name_and_value_list *es;
  object_literal_expression *e_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,'{');
  this_00 = object_literal_expression::elements(e);
  f = (expression *)0x0;
  do {
    peVar3 = (expression *)
             std::
             vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
             size(this_00);
    if (peVar3 <= f) {
      std::operator<<(this->os_,'}');
      return;
    }
    pvVar4 = std::
             vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
             operator[](this_00,(size_type)f);
    pVar1 = property_name_and_value::type(pvVar4);
    if (pVar1 == normal) {
      pcVar5 = "\t";
      if (f != (expression *)0x0) {
        pcVar5 = "], ";
      }
      std::operator<<(this->os_,pcVar5 + 1);
      pvVar4 = std::
               vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
               operator[](this_00,(size_type)f);
      peVar3 = property_name_and_value::name(pvVar4);
      accept<mjs::print_visitor>(peVar3,this);
      std::operator<<(this->os_,": ");
      pvVar4 = std::
               vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
               operator[](this_00,(size_type)f);
      peVar3 = property_name_and_value::value(pvVar4);
      accept<mjs::print_visitor>(peVar3,this);
    }
    else {
      pcVar5 = "";
      if (f != (expression *)0x0) {
        pcVar5 = ",";
      }
      std::operator<<(this->os_,pcVar5);
      pvVar4 = std::
               vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
               operator[](this_00,(size_type)f);
      peVar3 = property_name_and_value::value(pvVar4);
      iVar2 = (*(peVar3->super_syntax_node)._vptr_syntax_node[3])();
      if (iVar2 != 0xb) {
        __assert_fail("f.type() == expression_type::function",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                      ,0x3c,"void mjs::print_visitor::operator()(const object_literal_expression &)"
                     );
      }
      handle_function(this,(function_base *)(peVar3 + 1));
    }
    f = (expression *)((long)&(f->super_syntax_node)._vptr_syntax_node + 1);
  } while( true );
}

Assistant:

void operator()(const object_literal_expression& e) {
        os_ << '{';
        const auto& es = e.elements();
        for (size_t i = 0; i < es.size(); ++i) {
            if (es[i].type() == property_assignment_type::normal) {
                os_ << (i ? ", " : "");
                accept(es[i].name(), *this);
                os_ << ": ";
                accept(es[i].value(), *this);
            } else {
                os_ << (i ? "," : "");
                const auto& f = es[i].value();
                assert(f.type() == expression_type::function);
                handle_function(static_cast<const function_expression&>(f));
            }
        }
        os_ << '}';
    }